

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

StringPtr kj::operator*(uint param_1)

{
  LogSeverity severity_local;
  
  StringPtr::StringPtr((StringPtr *)&severity_local,operator*::SEVERITY_STRINGS[param_1]);
  return (StringPtr)_severity_local;
}

Assistant:

StringPtr KJ_STRINGIFY(LogSeverity severity) {
  static const char* SEVERITY_STRINGS[] = {
    "info",
    "warning",
    "error",
    "fatal",
    "debug"
  };

  return SEVERITY_STRINGS[static_cast<uint>(severity)];
}